

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O3

DFsVariable * __thiscall DFsScript::VariableForName(DFsScript *this,char *name)

{
  ushort uVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 aVar6;
  short sVar7;
  long lVar8;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 *paVar9;
  
  if (*name == '\0') {
    lVar8 = 0;
  }
  else {
    sVar3 = (short)*name + (short)name[1];
    if (name[1] == '\0') {
      sVar7 = 0;
    }
    else {
      if (name[2] == '\0') {
        sVar7 = 0;
      }
      else {
        sVar7 = (short)name[3];
      }
      sVar7 = sVar7 + name[2];
    }
    uVar1 = sVar3 + sVar7;
    uVar4 = sVar3 + sVar7 + 0xf;
    if (-1 < (short)uVar1) {
      uVar4 = uVar1;
    }
    lVar8 = (long)(short)(uVar1 - (uVar4 & 0xfff0));
  }
  aVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)this->variables[lVar8].field_0.p;
  if (aVar2.p != (DFsVariable *)0x0) {
    if ((((aVar2.p)->super_DObject).ObjectFlags & 0x20) == 0) {
      do {
        aVar6 = aVar2;
        iVar5 = strcmp(name,((aVar6.p)->Name).Chars);
        if (iVar5 == 0) {
          return aVar6.p;
        }
        aVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)((aVar6.p)->next).field_0.p;
        if (aVar2.p == (DFsVariable *)0x0) {
          return (DFsVariable *)0x0;
        }
      } while ((((aVar2.p)->super_DObject).ObjectFlags & 0x20) == 0);
      paVar9 = &((aVar6.p)->next).field_0;
    }
    else {
      paVar9 = &this->variables[lVar8].field_0;
    }
    paVar9->p = (DFsVariable *)0x0;
  }
  return (DFsVariable *)0x0;
}

Assistant:

DFsVariable *DFsScript::VariableForName(const char *name)
{
	int n = variable_hash(name);
	DFsVariable *current = variables[n];
	
	while(current)
    {
		if(!strcmp(name, current->Name))        // found it?
			return current;         
		current = current->next;        // check next in chain
    }
	
	return NULL;
}